

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

int If_CluSupport(word *t,int nVars)

{
  int iVar1;
  undefined4 local_1c;
  undefined4 local_18;
  int Supp;
  int v;
  int nVars_local;
  word *t_local;
  
  local_1c = 0;
  for (local_18 = 0; local_18 < nVars; local_18 = local_18 + 1) {
    iVar1 = If_CluHasVar(t,nVars,local_18);
    if (iVar1 != 0) {
      local_1c = 1 << ((byte)local_18 & 0x1f) | local_1c;
    }
  }
  return local_1c;
}

Assistant:

static inline int If_CluSupport( word * t, int nVars )
{
    int v, Supp = 0;
    for ( v = 0; v < nVars; v++ )
        if ( If_CluHasVar( t, nVars, v ) )
            Supp |= (1 << v);
    return Supp;
}